

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O3

void encode_mv_component(aom_writer *w,int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  aom_cdf_prob *icdf;
  uint uVar7;
  aom_cdf_prob (*icdf_00) [3];
  od_ec_enc *enc;
  int i;
  int s;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  aom_cdf_prob (*icdf_01) [5];
  
  iVar9 = -comp;
  if (0 < comp) {
    iVar9 = comp;
  }
  uVar5 = iVar9 - 1;
  uVar11 = 0x1f;
  if ((int)uVar5 >> 3 != 0) {
    for (; (uint)((int)uVar5 >> 3) >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar6 = (ulong)uVar11;
  if (uVar5 < 8) {
    uVar6 = 0;
  }
  uVar8 = uVar6 & 0xff;
  s = (int)uVar8;
  iVar10 = -8 << ((byte)uVar6 & 0x1f);
  if ((byte)uVar6 == 0) {
    iVar10 = 0;
  }
  enc = &w->ec;
  od_ec_encode_cdf_q15(enc,(uint)comp >> 0x1f,mvcomp->sign_cdf,2);
  if (w->allow_update_cdf != '\0') {
    uVar1 = mvcomp->sign_cdf[2];
    bVar4 = (char)(uVar1 >> 4) + 4;
    uVar2 = mvcomp->sign_cdf[0];
    if (comp < 0) {
      sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
    }
    else {
      sVar3 = -(uVar2 >> (bVar4 & 0x1f));
    }
    mvcomp->sign_cdf[0] = uVar2 + sVar3;
    mvcomp->sign_cdf[2] = uVar1 + (uVar1 < 0x20);
  }
  od_ec_encode_cdf_q15(enc,s,mvcomp->classes_cdf,0xb);
  if (w->allow_update_cdf != '\0') {
    uVar1 = mvcomp->classes_cdf[0xb];
    bVar4 = (char)(uVar1 >> 4) + 5;
    uVar6 = 0;
    do {
      uVar2 = mvcomp->classes_cdf[uVar6];
      if (uVar6 < uVar8) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar4 & 0x1f));
      }
      mvcomp->classes_cdf[uVar6] = sVar3 + uVar2;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 10);
    mvcomp->classes_cdf[0xb] = mvcomp->classes_cdf[0xb] + (ushort)(uVar1 < 0x20);
  }
  uVar11 = iVar10 + iVar9 + -1 >> 3;
  if (s == 0) {
    od_ec_encode_cdf_q15(enc,uVar11,mvcomp->class0_cdf,2);
    if (w->allow_update_cdf != '\0') {
      uVar1 = mvcomp->class0_cdf[2];
      bVar4 = (char)(uVar1 >> 4) + 4;
      uVar2 = mvcomp->class0_cdf[0];
      if ((char)uVar11 < '\x01') {
        sVar3 = -(uVar2 >> (bVar4 & 0x1f));
      }
      else {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
      }
      mvcomp->class0_cdf[0] = sVar3 + uVar2;
      mvcomp->class0_cdf[2] = uVar1 + (uVar1 < 0x20);
    }
  }
  else {
    icdf_00 = mvcomp->bits_cdf;
    uVar6 = 0;
    do {
      uVar7 = (uint)((uVar11 >> ((uint)uVar6 & 0x1f) & 1) != 0);
      od_ec_encode_cdf_q15(enc,uVar7,*icdf_00,2);
      if (w->allow_update_cdf != '\0') {
        uVar1 = (*icdf_00)[2];
        bVar4 = (char)(uVar1 >> 4) + 4;
        uVar2 = (*icdf_00)[0];
        if (uVar7 == 0) {
          sVar3 = -(uVar2 >> (bVar4 & 0x1f));
        }
        else {
          sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
        }
        (*icdf_00)[0] = uVar2 + sVar3;
        (*icdf_00)[2] = uVar1 + (uVar1 < 0x20);
      }
      uVar6 = uVar6 + 1;
      icdf_00 = icdf_00 + 1;
    } while (uVar8 != uVar6);
  }
  if (-1 < precision) {
    uVar7 = uVar5 >> 1 & 3;
    icdf_01 = mvcomp->class0_fp_cdf + (int)uVar11;
    if (s != 0) {
      icdf_01 = &mvcomp->fp_cdf;
    }
    od_ec_encode_cdf_q15(enc,uVar7,*icdf_01,4);
    if (w->allow_update_cdf != '\0') {
      uVar1 = (*icdf_01)[4];
      bVar4 = (char)(uVar1 >> 4) + 5;
      uVar6 = 0;
      do {
        uVar2 = (*icdf_01)[uVar6];
        if (uVar6 < uVar7) {
          sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
        }
        else {
          sVar3 = -(uVar2 >> (bVar4 & 0x1f));
        }
        (*icdf_01)[uVar6] = sVar3 + uVar2;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 3);
      (*icdf_01)[4] = (*icdf_01)[4] + (ushort)(uVar1 < 0x20);
    }
    if (precision != '\0') {
      icdf = mvcomp->class0_hp_cdf;
      if (s != 0) {
        icdf = mvcomp->hp_cdf;
      }
      od_ec_encode_cdf_q15(enc,uVar5 & 1,icdf,2);
      if (w->allow_update_cdf != '\0') {
        uVar1 = icdf[2];
        bVar4 = (char)(uVar1 >> 4) + 4;
        uVar2 = *icdf;
        if ((uVar5 & 1) == 0) {
          sVar3 = -(uVar2 >> (bVar4 & 0x1f));
        }
        else {
          sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar4 & 0x1f));
        }
        *icdf = uVar2 + sVar3;
        icdf[2] = uVar1 + (uVar1 < 0x20);
      }
    }
  }
  return;
}

Assistant:

static void encode_mv_component(aom_writer *w, int comp, nmv_component *mvcomp,
                                MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  aom_write_symbol(w, sign, mvcomp->sign_cdf, 2);

  // Class
  aom_write_symbol(w, mv_class, mvcomp->classes_cdf, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    aom_write_symbol(w, d, mvcomp->class0_cdf, CLASS0_SIZE);
  } else {
    int i;
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (i = 0; i < n; ++i)
      aom_write_symbol(w, (d >> i) & 1, mvcomp->bits_cdf[i], 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_write_symbol(
        w, fr,
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf,
        MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION)
    aom_write_symbol(
        w, hp, mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf,
        2);
}